

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_ObjRemoveConst(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar;
  word wVar2;
  word wVar3;
  word local_38;
  word uTruthF;
  int iObjIndex;
  word uTruth;
  int iFanout;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  wVar2 = Acb_ObjTruth(p,iObj);
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                  ,0xcd,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
  }
  iVar1 = Acb_ObjFaninNum(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("Acb_ObjFaninNum(p, iObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                  ,0xce,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
  }
  if ((wVar2 != 0) && (wVar2 != 0xffffffffffffffff)) {
    __assert_fail("uTruth == 0 || ~uTruth == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                  ,0xcf,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
  }
  while (iVar1 = Acb_ObjFindNodeFanout(p,iObj), -1 < iVar1) {
    iVar = Acb_ObjWhatFanin(p,iVar1,iObj);
    wVar3 = Acb_ObjTruth(p,iVar1);
    Acb_ObjRemoveFaninFanoutOne(p,iVar1,iObj);
    if ((wVar2 & 1) == 0) {
      local_38 = Abc_Tt6Cofactor0(wVar3,iVar);
    }
    else {
      local_38 = Abc_Tt6Cofactor1(wVar3,iVar);
    }
    wVar3 = Abc_Tt6RemoveVar(local_38,iVar);
    Vec_WrdWriteEntry(&p->vObjTruth,iVar1,wVar3);
    Acb_ObjSuppMin(p,iVar1);
  }
  iVar1 = Acb_ObjFanoutNum(p,iObj);
  if (iVar1 == 0) {
    Acb_ObjCleanType(p,iObj);
  }
  return;
}

Assistant:

void Acb_ObjRemoveConst( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 0 );
    assert( uTruth == 0 || ~uTruth == 0 );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        word uTruthF = Acb_ObjTruth( p, iFanout );
        Acb_ObjRemoveFaninFanoutOne( p, iFanout, iObj );
        uTruthF = (uTruth & 1) ? Abc_Tt6Cofactor1(uTruthF, iObjIndex) : Abc_Tt6Cofactor0(uTruthF, iObjIndex);
        Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6RemoveVar(uTruthF, iObjIndex) );
        Acb_ObjSuppMin( p, iFanout );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
        Acb_ObjCleanType( p, iObj );
}